

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O2

void __thiscall
cmCTestCoverageHandler::FindGCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  cmCTest *this_00;
  bool bVar1;
  ostream *poVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar3;
  _Base_ptr p_Var4;
  cmAlphaNum local_270;
  Glob gl;
  string daGlob;
  string local_1c8;
  ostringstream cmCTestLog_msg;
  
  cmsys::Glob::Glob(&gl);
  gl.Recurse = true;
  gl.RecurseThroughSymlinks = false;
  for (p_Var4 = (this->TargetDirs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->TargetDirs)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    bVar1 = IntersectsFilter(this,(LabelSet *)(p_Var4 + 2));
    if (bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCTestLog_msg);
      poVar2 = std::operator<<((ostream *)&cmCTestLog_msg,"   globbing for coverage in: ");
      poVar2 = std::operator<<(poVar2,(string *)(p_Var4 + 1));
      std::endl<char,std::char_traits<char>>(poVar2);
      this_00 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(this_00,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x649,(char *)local_270.View_._M_len,(this->super_cmCTestGenericHandler).Quiet);
      std::__cxx11::string::~string((string *)&local_270);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCTestLog_msg);
      _cmCTestLog_msg = p_Var4[1]._M_parent;
      local_270.View_._M_len = 5;
      local_270.View_._M_str = "/*.da";
      cmStrCat<>(&daGlob,(cmAlphaNum *)&cmCTestLog_msg,&local_270);
      cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
      pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (files,pvVar3);
      _cmCTestLog_msg = p_Var4[1]._M_parent;
      local_270.View_._M_len = 7;
      local_270.View_._M_str = "/*.gcda";
      cmStrCat<>(&local_1c8,(cmAlphaNum *)&cmCTestLog_msg,&local_270);
      std::__cxx11::string::operator=((string *)&daGlob,(string *)&local_1c8);
      std::__cxx11::string::~string((string *)&local_1c8);
      cmsys::Glob::FindFiles(&gl,&daGlob,(GlobMessages *)0x0);
      pvVar3 = cmsys::Glob::GetFiles_abi_cxx11_(&gl);
      ::cm::
      append<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_0>
                (files,pvVar3);
      std::__cxx11::string::~string((string *)&daGlob);
    }
  }
  cmsys::Glob::~Glob(&gl);
  return;
}

Assistant:

void cmCTestCoverageHandler::FindGCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOn();
  gl.RecurseThroughSymlinksOff();

  for (auto const& lm : this->TargetDirs) {
    // Skip targets containing no interesting labels.
    if (!this->IntersectsFilter(lm.second)) {
      continue;
    }

    // Coverage files appear next to their object files in the target
    // support directory.
    cmCTestOptionalLog(
      this->CTest, HANDLER_VERBOSE_OUTPUT,
      "   globbing for coverage in: " << lm.first << std::endl, this->Quiet);
    std::string daGlob = cmStrCat(lm.first, "/*.da");
    gl.FindFiles(daGlob);
    cm::append(files, gl.GetFiles());
    daGlob = cmStrCat(lm.first, "/*.gcda");
    gl.FindFiles(daGlob);
    cm::append(files, gl.GetFiles());
  }
}